

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O0

void __thiscall
wasm::CoalesceLocals::pickIndices
          (CoalesceLocals *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  pointer *__x;
  Index IVar1;
  uint uVar2;
  Function *this_00;
  size_t sVar3;
  reference pvVar4;
  iterator iVar5;
  iterator iVar6;
  reference puVar7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e8;
  uint local_e0;
  uint local_dc;
  uint reverseMaxIndex;
  Index reverseRemovedCopies;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reverseIndices;
  uint local_a4;
  Index i_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  uint local_88;
  uint local_84;
  uint maxIndex;
  Index removedCopies;
  undefined1 local_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  Index i;
  size_t numParams;
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjustedTotalCopies;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_local;
  CoalesceLocals *this_local;
  
  if ((this->
      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
      ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
      numLocals != 0) {
    if ((this->
        super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
        ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
        numLocals == 1) {
      adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (indices,(value_type_conflict2 *)
                         ((long)&adjustedTotalCopies.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numParams,
                 &(this->
                  super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                  ).
                  super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                  .totalCopies);
      this_00 = Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::
                getFunction((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                             *)&(this->
                                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                                ).
                                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                           );
      sVar3 = Function::getNumParams(this_00);
      for (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (uint)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < sVar3;
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1) {
        uVar2 = std::numeric_limits<unsigned_int>::max();
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numParams,
                            (ulong)(uint)order.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *pvVar4 = uVar2;
      }
      makeIdentity((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                   (this->
                   super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                   ).
                   super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                   .numLocals);
      adjustOrderByPriorities
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxIndex,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numParams);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxIndex);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxIndex);
      pickIndicesFromOrder
                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,indices,
                 &local_84);
      iVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(indices);
      iVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(indices);
      local_90 = std::
                 max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                           (iVar5._M_current,iVar6._M_current);
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_90);
      local_88 = *puVar7;
      setIdentity((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      for (local_a4 = (uint)sVar3;
          local_a4 <
          (this->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
          numLocals; local_a4 = local_a4 + 1) {
        IVar1 = (this->
                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                ).
                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                .numLocals;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                            (ulong)local_a4);
        *pvVar4 = ((uint)sVar3 + IVar1 + -1) - local_a4;
      }
      adjustOrderByPriorities
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &reverseIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numParams);
      __x = &reverseIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&reverseMaxIndex);
      pickIndicesFromOrder
                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&reverseMaxIndex,&local_dc);
      iVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&reverseMaxIndex);
      iVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&reverseMaxIndex);
      local_e8 = std::
                 max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                           (iVar5._M_current,iVar6._M_current);
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_e8);
      local_e0 = *puVar7;
      if ((local_84 < local_dc) || ((local_dc == local_84 && (local_e0 < local_88)))) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
                  (indices,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&reverseMaxIndex);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&reverseMaxIndex);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numParams);
    }
  }
  return;
}

Assistant:

void CoalesceLocals::pickIndices(std::vector<Index>& indices) {
  if (numLocals == 0) {
    return;
  }
  if (numLocals == 1) {
    indices.push_back(0);
    return;
  }
  // take into account total copies. but we must keep params in place, so give
  // them max priority
  auto adjustedTotalCopies = totalCopies;
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    adjustedTotalCopies[i] = std::numeric_limits<Index>::max();
  }
  // first try the natural order. this is less arbitrary than it seems, as the
  // program may have a natural order of locals inherent in it.
  auto order = makeIdentity(numLocals);
  order = adjustOrderByPriorities(order, adjustedTotalCopies);
  Index removedCopies;
  pickIndicesFromOrder(order, indices, removedCopies);
  auto maxIndex = *std::max_element(indices.begin(), indices.end());
  // next try the reverse order. this both gives us another chance at something
  // good, and also the very naturalness of the simple order may be quite
  // suboptimal
  setIdentity(order);
  for (Index i = numParams; i < numLocals; i++) {
    order[i] = numParams + numLocals - 1 - i;
  }
  order = adjustOrderByPriorities(order, adjustedTotalCopies);
  std::vector<Index> reverseIndices;
  Index reverseRemovedCopies;
  pickIndicesFromOrder(order, reverseIndices, reverseRemovedCopies);
  auto reverseMaxIndex =
    *std::max_element(reverseIndices.begin(), reverseIndices.end());
  // prefer to remove copies foremost, as it matters more for code size (minus
  // gzip), and improves throughput.
  if (reverseRemovedCopies > removedCopies ||
      (reverseRemovedCopies == removedCopies && reverseMaxIndex < maxIndex)) {
    indices.swap(reverseIndices);
  }
}